

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Acec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  char *FileName_1 [2];
  char *pTemp_1;
  Gia_Man_t *pGStack_b8;
  int i;
  Gia_Man_t *pGias [2];
  char *local_a0;
  char *FileName;
  char *pTemp;
  Gia_Man_t *pSecond;
  Gia_Man_t *pDual;
  Gia_Man_t *pGia1;
  Gia_Man_t *pGia0;
  int nArgcNew;
  int c;
  char **pArgvNew;
  Acec_ParCec_t *pPars;
  Acec_ParCec_t ParsCec;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pArgvNew = (char **)&pPars;
  Acec_ManCecSetDefaultParams((Acec_ParCec_t *)pArgvNew);
  Extra_UtilGetoptReset();
LAB_002c344e:
  do {
    pGia0._4_4_ = Extra_UtilGetopt(argc,argv,"CTmdtbvh");
    if (pGia0._4_4_ == -1) {
      if (*(int *)(pArgvNew + 1) == 0) {
        _nArgcNew = argv + globalUtilOptind;
        pGia0._0_4_ = argc - globalUtilOptind;
        if (((int)pGia0 == 0) || ((int)pGia0 == 1)) {
          if ((int)pGia0 == 0) {
            local_a0 = pAbc->pGia->pSpec;
            if (local_a0 == (char *)0x0) {
              Abc_Print(-1,"File name is not given on the command line.\n");
              return 1;
            }
          }
          else {
            local_a0 = *_nArgcNew;
            for (FileName = local_a0; *FileName != '\0'; FileName = FileName + 1) {
              if (*FileName == '>') {
                *FileName = '\\';
              }
            }
            ParsCec._32_8_ = fopen(local_a0,"r");
            if ((FILE *)ParsCec._32_8_ == (FILE *)0x0) {
              Abc_Print(-1,"Cannot open input file \"%s\". ",local_a0);
              pcVar4 = Extra_FileGetSimilarName
                                 (local_a0,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
              if (pcVar4 != (char *)0x0) {
                Abc_Print(1,"Did you mean \"%s\"?",pcVar4);
              }
              Abc_Print(1,"\n");
              return 1;
            }
            fclose((FILE *)ParsCec._32_8_);
          }
          pGVar3 = Gia_AigerRead(local_a0,0,0,0);
          if (pGVar3 == (Gia_Man_t *)0x0) {
            Abc_Print(-1,"Reading AIGER has failed.\n");
            return 0;
          }
          iVar2 = Acec_Solve(pAbc->pGia,pGVar3,(Acec_ParCec_t *)pArgvNew);
          pAbc->Status = iVar2;
          Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexComb);
          Gia_ManStop(pGVar3);
        }
        else {
          if ((int)pGia0 != 2) {
            Abc_Print(-1,"Too many command-line arguments.\n");
            return 1;
          }
          memset(&stack0xffffffffffffff48,0,0x10);
          FileName_1[0] = _nArgcNew[1];
          for (pTemp_1._4_4_ = 0; pTemp_1._4_4_ < 2; pTemp_1._4_4_ = pTemp_1._4_4_ + 1) {
            for (FileName_1[1] = FileName_1[(long)pTemp_1._4_4_ + -1]; *FileName_1[1] != '\0';
                FileName_1[1] = FileName_1[1] + 1) {
              if (*FileName_1[1] == '>') {
                *FileName_1[1] = '\\';
              }
            }
            ParsCec._32_8_ = fopen(FileName_1[(long)pTemp_1._4_4_ + -1],"r");
            if ((FILE *)ParsCec._32_8_ == (FILE *)0x0) {
              Abc_Print(-1,"Cannot open input file \"%s\". ",FileName_1[(long)pTemp_1._4_4_ + -1]);
              pcVar4 = Extra_FileGetSimilarName
                                 (FileName_1[(long)pTemp_1._4_4_ + -1],".aig",(char *)0x0,
                                  (char *)0x0,(char *)0x0,(char *)0x0);
              FileName_1[(long)pTemp_1._4_4_ + -1] = pcVar4;
              if (pcVar4 != (char *)0x0) {
                Abc_Print(1,"Did you mean \"%s\"?",FileName_1[(long)pTemp_1._4_4_ + -1]);
              }
              Abc_Print(1,"\n");
              return 1;
            }
            fclose((FILE *)ParsCec._32_8_);
            pGVar3 = Gia_AigerRead(FileName_1[(long)pTemp_1._4_4_ + -1],0,0,0);
            *(Gia_Man_t **)((long)&stack0xffffffffffffff48 + (long)pTemp_1._4_4_ * 8) = pGVar3;
            if (*(long *)((long)&stack0xffffffffffffff48 + (long)pTemp_1._4_4_ * 8) == 0) {
              Abc_Print(-1,"Reading AIGER has failed.\n");
              return 0;
            }
          }
          iVar2 = Acec_Solve(pGStack_b8,pGias[0],(Acec_ParCec_t *)pArgvNew);
          pAbc->Status = iVar2;
          Abc_FrameReplaceCex(pAbc,&pGStack_b8->pCexComb);
          Gia_ManStop(pGStack_b8);
          Gia_ManStop(pGias[0]);
        }
        return 0;
      }
      if (argc != globalUtilOptind) {
        Abc_Print(-1,
                  "Abc_CommandAbc9Acec(): If the input is a miter, it cannot be given on the command line.\n"
                 );
        return 1;
      }
      if (pAbc->pGia != (Gia_Man_t *)0x0) {
        if (*(int *)((long)pArgvNew + 0xc) == 0) {
          if (*(int *)(pArgvNew + 2) == 0) {
            if (*(int *)(pArgvNew + 3) == 0) {
              Abc_Print(1,
                        "Assuming the current network is a regular single- or multi-output miter. (Conflict limit = %d.)\n"
                        ,(ulong)*(uint *)pArgvNew);
            }
            pGVar3 = Gia_ManDemiterToDual(pAbc->pGia);
            Gia_ManDemiterDual(pGVar3,&pGia1,&pDual);
            Gia_ManStop(pGVar3);
            iVar2 = Acec_Solve(pGia1,pDual,(Acec_ParCec_t *)pArgvNew);
            pAbc->Status = iVar2;
          }
          else {
            uVar1 = Gia_ManPoNum(pAbc->pGia);
            if ((uVar1 & 1) != 0) {
              Abc_Print(-1,"The two-output miter should have an even number of outputs.\n");
              return 1;
            }
            if (*(int *)(pArgvNew + 3) == 0) {
              Abc_Print(1,
                        "Assuming the current network is a two-word miter. (Conflict limit = %d.)\n"
                        ,(ulong)*(uint *)pArgvNew);
            }
            Gia_ManDemiterTwoWords(pAbc->pGia,&pGia1,&pDual);
            iVar2 = Acec_Solve(pGia1,pDual,(Acec_ParCec_t *)pArgvNew);
            pAbc->Status = iVar2;
          }
        }
        else {
          uVar1 = Gia_ManPoNum(pAbc->pGia);
          if ((uVar1 & 1) != 0) {
            Abc_Print(-1,"The dual-output miter should have an even number of outputs.\n");
            return 1;
          }
          if (*(int *)(pArgvNew + 3) == 0) {
            Abc_Print(1,
                      "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n"
                      ,(ulong)*(uint *)pArgvNew);
          }
          Gia_ManDemiterDual(pAbc->pGia,&pGia1,&pDual);
          iVar2 = Acec_Solve(pGia1,pDual,(Acec_ParCec_t *)pArgvNew);
          pAbc->Status = iVar2;
        }
        Abc_FrameReplaceCex(pAbc,&pGia1->pCexComb);
        Gia_ManStop(pGia1);
        Gia_ManStop(pDual);
        return 0;
      }
      Abc_Print(-1,"Abc_CommandAbc9Acec(): There is no AIG.\n");
      return 1;
    }
    switch(pGia0._4_4_) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_002c3ca7;
      }
      iVar2 = atoi(argv[globalUtilOptind]);
      *(int *)pArgvNew = iVar2;
      iVar2 = *(int *)pArgvNew;
      break;
    default:
      goto LAB_002c3ca7;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002c3ca7;
      }
      iVar2 = atoi(argv[globalUtilOptind]);
      *(int *)((long)pArgvNew + 4) = iVar2;
      iVar2 = *(int *)((long)pArgvNew + 4);
      break;
    case 0x62:
      *(uint *)((long)pArgvNew + 0x14) = *(uint *)((long)pArgvNew + 0x14) ^ 1;
      goto LAB_002c344e;
    case 100:
      *(uint *)((long)pArgvNew + 0xc) = *(uint *)((long)pArgvNew + 0xc) ^ 1;
      goto LAB_002c344e;
    case 0x68:
      goto LAB_002c3ca7;
    case 0x6d:
      *(uint *)(pArgvNew + 1) = *(uint *)(pArgvNew + 1) ^ 1;
      goto LAB_002c344e;
    case 0x74:
      *(uint *)(pArgvNew + 2) = *(uint *)(pArgvNew + 2) ^ 1;
      goto LAB_002c344e;
    case 0x76:
      *(uint *)(pArgvNew + 4) = *(uint *)(pArgvNew + 4) ^ 1;
      goto LAB_002c344e;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 0) {
LAB_002c3ca7:
      Abc_Print(-2,"usage: &acec [-CT num] [-mdtbvh] <file1> <file2>\n");
      Abc_Print(-2,"\t         combinational equivalence checking for arithmetic circuits\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)*(uint *)pArgvNew);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)*(uint *)((long)pArgvNew + 4));
      pcVar4 = "two circuits";
      if (*(int *)(pArgvNew + 1) != 0) {
        pcVar4 = "miter";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. two circuits [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (*(int *)((long)pArgvNew + 0xc) != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle using dual output miter [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (*(int *)(pArgvNew + 2) != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-t     : toggle using two-word miter [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (*(int *)((long)pArgvNew + 0x14) != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-b     : toggle working with Booth multipliers [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (*(int *)(pArgvNew + 4) != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\tfile1  : (optional) the file with the first network\n");
      Abc_Print(-2,"\tfile2  : (optional) the file with the second network\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Acec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Acec_ParCec_t ParsCec, * pPars = &ParsCec;
    char ** pArgvNew;
    int c, nArgcNew;
    Acec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTmdtbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'm':
            pPars->fMiter ^= 1;
            break;
        case 'd':
            pPars->fDualOutput ^= 1;
            break;
        case 't':
            pPars->fTwoOutput ^= 1;
            break;
        case 'b':
            pPars->fBooth ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pPars->fMiter )
    {
        Gia_Man_t * pGia0, * pGia1, * pDual;
        if ( argc != globalUtilOptind )
        {
            Abc_Print( -1, "Abc_CommandAbc9Acec(): If the input is a miter, it cannot be given on the command line.\n" );
            return 1;
        }
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Acec(): There is no AIG.\n" );
            return 1;
        }
        if ( pPars->fDualOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            Gia_ManDemiterDual( pAbc->pGia, &pGia0, &pGia1 );
            pAbc->Status = Acec_Solve( pGia0, pGia1, pPars );
        }
        else if ( pPars->fTwoOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The two-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a two-word miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            Gia_ManDemiterTwoWords( pAbc->pGia, &pGia0, &pGia1 );
            pAbc->Status = Acec_Solve( pGia0, pGia1, pPars );
        }
        else // regular single- or multi-output miter
        {
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a regular single- or multi-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            pDual = Gia_ManDemiterToDual( pAbc->pGia );
            Gia_ManDemiterDual( pDual, &pGia0, &pGia1 );
            Gia_ManStop( pDual );
            pAbc->Status = Acec_Solve( pGia0, pGia1, pPars );
        }
        Abc_FrameReplaceCex( pAbc, &pGia0->pCexComb );
        Gia_ManStop( pGia0 );
        Gia_ManStop( pGia1 );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew == 0 || nArgcNew == 1 )
    {
        Gia_Man_t * pSecond;
        char * pTemp, * FileName = NULL;
        if ( nArgcNew == 0 )
        {
            FileName = pAbc->pGia->pSpec;
            if ( FileName == NULL )
            {
                Abc_Print( -1, "File name is not given on the command line.\n" );
                return 1;
            }
        }
        else // if ( nArgcNew == 1 )
        {
            FileName = pArgvNew[0];
            // fix the wrong symbol
            for ( pTemp = FileName; *pTemp; pTemp++ )
                if ( *pTemp == '>' )
                    *pTemp = '\\';
            if ( (pFile = fopen( FileName, "r" )) == NULL )
            {
                Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
                if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
                    Abc_Print( 1, "Did you mean \"%s\"?", FileName );
                Abc_Print( 1, "\n" );
                return 1;
            }
            fclose( pFile );
        }
        pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
        if ( pSecond == NULL )
        {
            Abc_Print( -1, "Reading AIGER has failed.\n" );
            return 0;
        }
        pAbc->Status = Acec_Solve( pAbc->pGia, pSecond, pPars );
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        Gia_ManStop( pSecond );
    }
    else if ( nArgcNew == 2 )
    {
        Gia_Man_t * pGias[2] = {NULL};  int i;
        char * pTemp, * FileName[2] = { pArgvNew[0], pArgvNew[1] };
        for ( i = 0; i < 2; i++ )
        {
            // fix the wrong symbol
            for ( pTemp = FileName[i]; *pTemp; pTemp++ )
                if ( *pTemp == '>' )
                    *pTemp = '\\';
            if ( (pFile = fopen( FileName[i], "r" )) == NULL )
            {
                Abc_Print( -1, "Cannot open input file \"%s\". ", FileName[i] );
                if ( (FileName[i] = Extra_FileGetSimilarName( FileName[i], ".aig", NULL, NULL, NULL, NULL )) )
                    Abc_Print( 1, "Did you mean \"%s\"?", FileName[i] );
                Abc_Print( 1, "\n" );
                return 1;
            }
            fclose( pFile );
            pGias[i] = Gia_AigerRead( FileName[i], 0, 0, 0 );
            if ( pGias[i] == NULL )
            {
                Abc_Print( -1, "Reading AIGER has failed.\n" );
                return 0;
            }
        }
        pAbc->Status = Acec_Solve( pGias[0], pGias[1], pPars );
        Abc_FrameReplaceCex( pAbc, &pGias[0]->pCexComb );
        Gia_ManStop( pGias[0] );
        Gia_ManStop( pGias[1] );
    }
    else
    {
        Abc_Print( -1, "Too many command-line arguments.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &acec [-CT num] [-mdtbvh] <file1> <file2>\n" );
    Abc_Print( -2, "\t         combinational equivalence checking for arithmetic circuits\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-m     : toggle miter vs. two circuits [default = %s]\n", pPars->fMiter? "miter":"two circuits");
    Abc_Print( -2, "\t-d     : toggle using dual output miter [default = %s]\n", pPars->fDualOutput? "yes":"no");
    Abc_Print( -2, "\t-t     : toggle using two-word miter [default = %s]\n", pPars->fTwoOutput? "yes":"no");
    Abc_Print( -2, "\t-b     : toggle working with Booth multipliers [default = %s]\n", pPars->fBooth? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile1  : (optional) the file with the first network\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second network\n");
    return 1;
}